

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O3

void * printable_vtable::clone_impl<large_printable>(void *value)

{
  vector<double,_std::allocator<double>_> *this;
  
  allocations()::allocations_ = allocations()::allocations_ + 1;
  this = (vector<double,_std::allocator<double>_> *)malloc(0x2018);
  std::vector<double,_std::allocator<double>_>::vector
            (this,(vector<double,_std::allocator<double>_> *)value);
  return this;
}

Assistant:

static void * clone_impl (void * value)
    { return new ValueType(*static_cast<ValueType*>(value)); }